

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O3

var __thiscall
cs_impl::hash_set_cs_ext::intersect(hash_set_cs_ext *this,hash_set *lhs,hash_set *rhs)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined1 auVar13 [11];
  undefined1 auVar14 [11];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [13];
  undefined1 auVar18 [13];
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  flat_hash_set<cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
  *pfVar21;
  uint uVar22;
  char *pcVar23;
  value_type *it;
  slot_type *key;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  const_iterator cVar24;
  flat_hash_set<cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
  *local_50;
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>::iterator,_bool>
  local_48;
  
  any::
  make<phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>>
            ();
  pfVar21 = any::
            val<phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>>
                      ((any *)this);
  pcVar2 = (lhs->
           super_raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
           ).ctrl_;
  key = (lhs->
        super_raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
        ).slots_;
  cVar1 = *pcVar2;
  pcVar23 = pcVar2;
  while (cVar1 < -1) {
    iVar9 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                   CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
    iVar10 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                    CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
    iVar11 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                    CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
    iVar12 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                    CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
    in_XMM1_Ba = -(*pcVar23 < (char)iVar9);
    in_XMM1_Bb = -(pcVar23[1] < (char)((uint)iVar9 >> 8));
    in_XMM1_Bc = -(pcVar23[2] < (char)((uint)iVar9 >> 0x10));
    in_XMM1_Bd = -(pcVar23[3] < (char)((uint)iVar9 >> 0x18));
    in_XMM1_Be = -(pcVar23[4] < (char)iVar10);
    in_XMM1_Bf = -(pcVar23[5] < (char)((uint)iVar10 >> 8));
    in_XMM1_Bg = -(pcVar23[6] < (char)((uint)iVar10 >> 0x10));
    in_XMM1_Bh = -(pcVar23[7] < (char)((uint)iVar10 >> 0x18));
    in_XMM1_Bi = -(pcVar23[8] < (char)iVar11);
    in_XMM1_Bj = -(pcVar23[9] < (char)((uint)iVar11 >> 8));
    in_XMM1_Bk = -(pcVar23[10] < (char)((uint)iVar11 >> 0x10));
    in_XMM1_Bl = -(pcVar23[0xb] < (char)((uint)iVar11 >> 0x18));
    in_XMM1_Bm = -(pcVar23[0xc] < (char)iVar12);
    in_XMM1_Bn = -(pcVar23[0xd] < (char)((uint)iVar12 >> 8));
    in_XMM1_Bo = -(pcVar23[0xe] < (char)((uint)iVar12 >> 0x10));
    in_XMM1_Bp = -(pcVar23[0xf] < (char)((uint)iVar12 >> 0x18));
    auVar5[1] = in_XMM1_Bb;
    auVar5[0] = in_XMM1_Ba;
    auVar5[2] = in_XMM1_Bc;
    auVar5[3] = in_XMM1_Bd;
    auVar5[4] = in_XMM1_Be;
    auVar5[5] = in_XMM1_Bf;
    auVar5[6] = in_XMM1_Bg;
    auVar5[7] = in_XMM1_Bh;
    auVar5[8] = in_XMM1_Bi;
    auVar5[9] = in_XMM1_Bj;
    auVar5[10] = in_XMM1_Bk;
    auVar5[0xb] = in_XMM1_Bl;
    auVar5[0xc] = in_XMM1_Bm;
    auVar5[0xd] = in_XMM1_Bn;
    auVar5[0xe] = in_XMM1_Bo;
    auVar5[0xf] = in_XMM1_Bp;
    auVar6[1] = in_XMM1_Bb;
    auVar6[0] = in_XMM1_Ba;
    auVar6[2] = in_XMM1_Bc;
    auVar6[3] = in_XMM1_Bd;
    auVar6[4] = in_XMM1_Be;
    auVar6[5] = in_XMM1_Bf;
    auVar6[6] = in_XMM1_Bg;
    auVar6[7] = in_XMM1_Bh;
    auVar6[8] = in_XMM1_Bi;
    auVar6[9] = in_XMM1_Bj;
    auVar6[10] = in_XMM1_Bk;
    auVar6[0xb] = in_XMM1_Bl;
    auVar6[0xc] = in_XMM1_Bm;
    auVar6[0xd] = in_XMM1_Bn;
    auVar6[0xe] = in_XMM1_Bo;
    auVar6[0xf] = in_XMM1_Bp;
    auVar19[1] = in_XMM1_Bd;
    auVar19[0] = in_XMM1_Bc;
    auVar19[2] = in_XMM1_Be;
    auVar19[3] = in_XMM1_Bf;
    auVar19[4] = in_XMM1_Bg;
    auVar19[5] = in_XMM1_Bh;
    auVar19[6] = in_XMM1_Bi;
    auVar19[7] = in_XMM1_Bj;
    auVar19[8] = in_XMM1_Bk;
    auVar19[9] = in_XMM1_Bl;
    auVar19[10] = in_XMM1_Bm;
    auVar19[0xb] = in_XMM1_Bn;
    auVar19[0xc] = in_XMM1_Bo;
    auVar19[0xd] = in_XMM1_Bp;
    auVar17[1] = in_XMM1_Be;
    auVar17[0] = in_XMM1_Bd;
    auVar17[2] = in_XMM1_Bf;
    auVar17[3] = in_XMM1_Bg;
    auVar17[4] = in_XMM1_Bh;
    auVar17[5] = in_XMM1_Bi;
    auVar17[6] = in_XMM1_Bj;
    auVar17[7] = in_XMM1_Bk;
    auVar17[8] = in_XMM1_Bl;
    auVar17[9] = in_XMM1_Bm;
    auVar17[10] = in_XMM1_Bn;
    auVar17[0xb] = in_XMM1_Bo;
    auVar17[0xc] = in_XMM1_Bp;
    auVar15[1] = in_XMM1_Bf;
    auVar15[0] = in_XMM1_Be;
    auVar15[2] = in_XMM1_Bg;
    auVar15[3] = in_XMM1_Bh;
    auVar15[4] = in_XMM1_Bi;
    auVar15[5] = in_XMM1_Bj;
    auVar15[6] = in_XMM1_Bk;
    auVar15[7] = in_XMM1_Bl;
    auVar15[8] = in_XMM1_Bm;
    auVar15[9] = in_XMM1_Bn;
    auVar15[10] = in_XMM1_Bo;
    auVar15[0xb] = in_XMM1_Bp;
    auVar13[1] = in_XMM1_Bg;
    auVar13[0] = in_XMM1_Bf;
    auVar13[2] = in_XMM1_Bh;
    auVar13[3] = in_XMM1_Bi;
    auVar13[4] = in_XMM1_Bj;
    auVar13[5] = in_XMM1_Bk;
    auVar13[6] = in_XMM1_Bl;
    auVar13[7] = in_XMM1_Bm;
    auVar13[8] = in_XMM1_Bn;
    auVar13[9] = in_XMM1_Bo;
    auVar13[10] = in_XMM1_Bp;
    uVar22 = (ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB141(auVar19 >> 7,0) & 1) << 2 |
                      (ushort)(SUB131(auVar17 >> 7,0) & 1) << 3 |
                      (ushort)(SUB121(auVar15 >> 7,0) & 1) << 4 |
                      (ushort)(SUB111(auVar13 >> 7,0) & 1) << 5 |
                      (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                               CONCAT18(in_XMM1_Bo,
                                                        CONCAT17(in_XMM1_Bn,
                                                                 CONCAT16(in_XMM1_Bm,
                                                                          CONCAT15(in_XMM1_Bl,
                                                                                   CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                      (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                               CONCAT17(in_XMM1_Bo,
                                                        CONCAT16(in_XMM1_Bn,
                                                                 CONCAT15(in_XMM1_Bm,
                                                                          CONCAT14(in_XMM1_Bl,
                                                                                   CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                     7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
    uVar4 = 0;
    if (uVar22 != 0) {
      for (; (uVar22 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
      }
    }
    key = key + uVar4;
    cVar1 = pcVar23[uVar4];
    pcVar23 = pcVar23 + uVar4;
  }
  sVar3 = (lhs->
          super_raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
          ).capacity_;
  if (pcVar23 != pcVar2 + sVar3) {
    do {
      cVar24 = phmap::priv::
               raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
               ::find<cs_impl::any>
                         (&rhs->
                           super_raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
                          ,key);
      if (cVar24.inner_.ctrl_ !=
          (rhs->
          super_raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
          ).ctrl_ + (rhs->
                    super_raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
                    ).capacity_) {
        local_50 = pfVar21;
        phmap::priv::
        raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>
        ::EmplaceDecomposable::operator()(&local_48,&local_50,key,key);
      }
      key = key + 1;
      cVar1 = pcVar23[1];
      pcVar23 = pcVar23 + 1;
      while (cVar1 < -1) {
        iVar9 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                       CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
        iVar10 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be)))
                        == CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be)))
                        );
        iVar11 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                        == CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                        );
        iVar12 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        == CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        );
        in_XMM1_Ba = -(*pcVar23 < (char)iVar9);
        in_XMM1_Bb = -(pcVar23[1] < (char)((uint)iVar9 >> 8));
        in_XMM1_Bc = -(pcVar23[2] < (char)((uint)iVar9 >> 0x10));
        in_XMM1_Bd = -(pcVar23[3] < (char)((uint)iVar9 >> 0x18));
        in_XMM1_Be = -(pcVar23[4] < (char)iVar10);
        in_XMM1_Bf = -(pcVar23[5] < (char)((uint)iVar10 >> 8));
        in_XMM1_Bg = -(pcVar23[6] < (char)((uint)iVar10 >> 0x10));
        in_XMM1_Bh = -(pcVar23[7] < (char)((uint)iVar10 >> 0x18));
        in_XMM1_Bi = -(pcVar23[8] < (char)iVar11);
        in_XMM1_Bj = -(pcVar23[9] < (char)((uint)iVar11 >> 8));
        in_XMM1_Bk = -(pcVar23[10] < (char)((uint)iVar11 >> 0x10));
        in_XMM1_Bl = -(pcVar23[0xb] < (char)((uint)iVar11 >> 0x18));
        in_XMM1_Bm = -(pcVar23[0xc] < (char)iVar12);
        in_XMM1_Bn = -(pcVar23[0xd] < (char)((uint)iVar12 >> 8));
        in_XMM1_Bo = -(pcVar23[0xe] < (char)((uint)iVar12 >> 0x10));
        in_XMM1_Bp = -(pcVar23[0xf] < (char)((uint)iVar12 >> 0x18));
        auVar7[1] = in_XMM1_Bb;
        auVar7[0] = in_XMM1_Ba;
        auVar7[2] = in_XMM1_Bc;
        auVar7[3] = in_XMM1_Bd;
        auVar7[4] = in_XMM1_Be;
        auVar7[5] = in_XMM1_Bf;
        auVar7[6] = in_XMM1_Bg;
        auVar7[7] = in_XMM1_Bh;
        auVar7[8] = in_XMM1_Bi;
        auVar7[9] = in_XMM1_Bj;
        auVar7[10] = in_XMM1_Bk;
        auVar7[0xb] = in_XMM1_Bl;
        auVar7[0xc] = in_XMM1_Bm;
        auVar7[0xd] = in_XMM1_Bn;
        auVar7[0xe] = in_XMM1_Bo;
        auVar7[0xf] = in_XMM1_Bp;
        auVar8[1] = in_XMM1_Bb;
        auVar8[0] = in_XMM1_Ba;
        auVar8[2] = in_XMM1_Bc;
        auVar8[3] = in_XMM1_Bd;
        auVar8[4] = in_XMM1_Be;
        auVar8[5] = in_XMM1_Bf;
        auVar8[6] = in_XMM1_Bg;
        auVar8[7] = in_XMM1_Bh;
        auVar8[8] = in_XMM1_Bi;
        auVar8[9] = in_XMM1_Bj;
        auVar8[10] = in_XMM1_Bk;
        auVar8[0xb] = in_XMM1_Bl;
        auVar8[0xc] = in_XMM1_Bm;
        auVar8[0xd] = in_XMM1_Bn;
        auVar8[0xe] = in_XMM1_Bo;
        auVar8[0xf] = in_XMM1_Bp;
        auVar20[1] = in_XMM1_Bd;
        auVar20[0] = in_XMM1_Bc;
        auVar20[2] = in_XMM1_Be;
        auVar20[3] = in_XMM1_Bf;
        auVar20[4] = in_XMM1_Bg;
        auVar20[5] = in_XMM1_Bh;
        auVar20[6] = in_XMM1_Bi;
        auVar20[7] = in_XMM1_Bj;
        auVar20[8] = in_XMM1_Bk;
        auVar20[9] = in_XMM1_Bl;
        auVar20[10] = in_XMM1_Bm;
        auVar20[0xb] = in_XMM1_Bn;
        auVar20[0xc] = in_XMM1_Bo;
        auVar20[0xd] = in_XMM1_Bp;
        auVar18[1] = in_XMM1_Be;
        auVar18[0] = in_XMM1_Bd;
        auVar18[2] = in_XMM1_Bf;
        auVar18[3] = in_XMM1_Bg;
        auVar18[4] = in_XMM1_Bh;
        auVar18[5] = in_XMM1_Bi;
        auVar18[6] = in_XMM1_Bj;
        auVar18[7] = in_XMM1_Bk;
        auVar18[8] = in_XMM1_Bl;
        auVar18[9] = in_XMM1_Bm;
        auVar18[10] = in_XMM1_Bn;
        auVar18[0xb] = in_XMM1_Bo;
        auVar18[0xc] = in_XMM1_Bp;
        auVar16[1] = in_XMM1_Bf;
        auVar16[0] = in_XMM1_Be;
        auVar16[2] = in_XMM1_Bg;
        auVar16[3] = in_XMM1_Bh;
        auVar16[4] = in_XMM1_Bi;
        auVar16[5] = in_XMM1_Bj;
        auVar16[6] = in_XMM1_Bk;
        auVar16[7] = in_XMM1_Bl;
        auVar16[8] = in_XMM1_Bm;
        auVar16[9] = in_XMM1_Bn;
        auVar16[10] = in_XMM1_Bo;
        auVar16[0xb] = in_XMM1_Bp;
        auVar14[1] = in_XMM1_Bg;
        auVar14[0] = in_XMM1_Bf;
        auVar14[2] = in_XMM1_Bh;
        auVar14[3] = in_XMM1_Bi;
        auVar14[4] = in_XMM1_Bj;
        auVar14[5] = in_XMM1_Bk;
        auVar14[6] = in_XMM1_Bl;
        auVar14[7] = in_XMM1_Bm;
        auVar14[8] = in_XMM1_Bn;
        auVar14[9] = in_XMM1_Bo;
        auVar14[10] = in_XMM1_Bp;
        uVar22 = (ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB141(auVar20 >> 7,0) & 1) << 2 |
                          (ushort)(SUB131(auVar18 >> 7,0) & 1) << 3 |
                          (ushort)(SUB121(auVar16 >> 7,0) & 1) << 4 |
                          (ushort)(SUB111(auVar14 >> 7,0) & 1) << 5 |
                          (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                   CONCAT18(in_XMM1_Bo,
                                                            CONCAT17(in_XMM1_Bn,
                                                                     CONCAT16(in_XMM1_Bm,
                                                                              CONCAT15(in_XMM1_Bl,
                                                                                       CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                          (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                   CONCAT17(in_XMM1_Bo,
                                                            CONCAT16(in_XMM1_Bn,
                                                                     CONCAT15(in_XMM1_Bm,
                                                                              CONCAT14(in_XMM1_Bl,
                                                                                       CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                         7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
        uVar4 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
          }
        }
        key = key + uVar4;
        cVar1 = pcVar23[uVar4];
        pcVar23 = pcVar23 + uVar4;
      }
    } while (pcVar23 != pcVar2 + sVar3);
  }
  return (var)(proxy *)this;
}

Assistant:

var intersect(const hash_set &lhs, const hash_set &rhs)
		{
			var ret = var::make<hash_set>();
			hash_set &s = ret.val<hash_set>();
			for (auto &it: lhs) {
				if (rhs.count(it) > 0)
					s.emplace(it);
			}
			return ret;
		}